

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O0

aiMaterial * __thiscall
Assimp::Ogre::OgreImporter::ReadMaterial
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,string *materialName)

{
  IOSystem *pIVar1;
  byte bVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  Logger *pLVar9;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar10;
  basic_formatter *pbVar11;
  pointer pIVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar13;
  pointer pIVar14;
  undefined4 extraout_var_01;
  OgreImporter *this_00;
  string *psVar15;
  char *pcVar16;
  undefined1 local_29d4 [8];
  aiString ts_6;
  undefined1 local_25ac [8];
  aiString ts_5;
  undefined1 local_2184 [8];
  aiString ts_4;
  undefined1 local_1d5c [8];
  aiString ts_3;
  ai_real local_1938;
  ai_real local_1934;
  float Shininess_1;
  float Shininess;
  aiString ts_2;
  aiString ts_1;
  string techniqueName;
  string local_f90;
  fpos<__mbstate_t> local_f70;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  string local_de8;
  string local_dc8;
  string local_da8;
  allocator<char> local_d81;
  undefined1 local_d80 [8];
  string partTechnique;
  undefined1 local_d58 [8];
  string partMaterial;
  string linePart;
  aiString ts;
  aiMaterial *material;
  string local_790;
  value_type local_76a;
  allocator_type local_769;
  undefined1 local_768 [8];
  vector<char,_std::allocator<char>_> data;
  string local_5d8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_5b8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> stream;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_430;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_298;
  allocator<char> local_271;
  string local_270;
  ulong local_250;
  size_t i;
  IOStream *materialFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potentialFiles;
  stringstream ss;
  ostream local_1a8 [376];
  string *local_30;
  string *materialName_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  OgreImporter *this_local;
  
  local_30 = materialName;
  materialName_local = (string *)pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &potentialFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d0);
    std::operator+(&local_1f0,local_30,".material");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    pIVar1 = pIOHandler_local;
    std::__cxx11::string::rfind((char *)pIOHandler_local,0xc7e64c);
    std::__cxx11::string::substr((ulong)&materialFile,(ulong)pIVar1);
    std::operator+(&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &materialFile,".material");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d0,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&materialFile);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d0,&this->m_userDefinedMaterialLibFile);
    }
    i = 0;
    for (local_250 = 0; uVar6 = local_250,
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d0), psVar15 = materialName_local, uVar6 < sVar7;
        local_250 = local_250 + 1) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d0,local_250);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"rb",&local_271);
      i = (size_t)IOSystem::Open((IOSystem *)psVar15,pvVar8,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      if (i != 0) break;
      pLVar9 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[27]>(&local_410,(char (*) [27])"Source file for material \'");
      pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_410,local_30);
      pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar10,(char (*) [3])"\' ");
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d0,local_250);
      pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar10,pvVar8);
      pbVar11 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar10,(char (*) [16])0xca7cb6);
      Formatter::basic_formatter::operator_cast_to_string(&local_298,pbVar11);
      Logger::debug(pLVar9,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_410);
    }
    if (i == 0) {
      pLVar9 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                (&local_5a8,(char (*) [42])"Failed to find source file for material \'");
      pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_5a8,local_30);
      pbVar11 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar10,(char (*) [2])0xc5c617);
      Formatter::basic_formatter::operator_cast_to_string(&local_430,pbVar11);
      Logger::error(pLVar9,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_5a8);
      this_local = (OgreImporter *)0x0;
      stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._4_4_ = 1;
    }
    else {
      std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
      unique_ptr<std::default_delete<Assimp::IOStream>,void>
                ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_5b8,
                 (pointer)i);
      pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                operator->(&local_5b8);
      iVar5 = (*pIVar12->_vptr_IOStream[6])();
      bVar4 = CONCAT44(extraout_var,iVar5) != 0;
      if (bVar4) {
        pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                  operator->(&local_5b8);
        iVar5 = (*pIVar12->_vptr_IOStream[6])();
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_768,CONCAT44(extraout_var_00,iVar5),
                   &local_769);
        std::allocator<char>::~allocator(&local_769);
        pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                  operator->(&local_5b8);
        pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_768,0);
        pIVar14 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                  operator->(&local_5b8);
        iVar5 = (*pIVar14->_vptr_IOStream[6])();
        (*pIVar12->_vptr_IOStream[2])(pIVar12,pvVar13,CONCAT44(extraout_var_01,iVar5),1);
        BaseImporter::ConvertToUTF8((vector<char,_std::allocator<char>_> *)local_768);
        local_76a = '\0';
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)local_768,&local_76a);
        pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_768,0);
        std::operator<<(local_1a8,pvVar13);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_768);
      }
      else {
        pLVar9 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[27]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                   (char (*) [27])"Source file for material \'");
        pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                            ,local_30);
        pbVar11 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar10,(char (*) [29])"\' is empty (size is 0 bytes)");
        Formatter::basic_formatter::operator_cast_to_string(&local_5d8,pbVar11);
        Logger::warn(pLVar9,&local_5d8);
        std::__cxx11::string::~string((string *)&local_5d8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
        this_local = (OgreImporter *)0x0;
      }
      stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._5_3_ = 0;
      stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._4_1_ = !bVar4;
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_5b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
    if (stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
        _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
        super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._4_4_ == 0) {
      pLVar9 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[19]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&material,
                 (char (*) [19])"Reading material \'");
      pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &material,local_30);
      pbVar11 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar10,(char (*) [2])0xc5c617);
      Formatter::basic_formatter::operator_cast_to_string(&local_790,pbVar11);
      Logger::debug(pLVar9,&local_790);
      std::__cxx11::string::~string((string *)&local_790);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &material);
      this_00 = (OgreImporter *)operator_new(0x10);
      aiMaterial::aiMaterial((aiMaterial *)this_00);
      std::
      map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
      ::clear(&this->m_textures);
      aiString::aiString((aiString *)((long)&linePart.field_2 + 0xc),local_30);
      aiMaterial::AddProperty
                ((aiMaterial *)this_00,(aiString *)((long)&linePart.field_2 + 0xc),"?mat.name",0,0);
      std::__cxx11::string::string((string *)(partMaterial.field_2._M_local_buf + 8));
      std::operator>>((istream *)
                      &potentialFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (string *)(partMaterial.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d58,"material",
                 (allocator<char> *)(partTechnique.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(partTechnique.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_d80,"technique",&local_d81)
      ;
      std::allocator<char>::~allocator(&local_d81);
      while( true ) {
        bVar2 = std::ios::eof();
        if (((bVar2 ^ 0xff) & 1) == 0) break;
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&partMaterial.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )partComment_abi_cxx11_);
        if (_Var3) {
          NextAfterNewLine(&local_da8,
                           (stringstream *)
                           &potentialFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (string *)((long)&partMaterial.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_da8);
        }
        else {
          bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&partMaterial.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d58);
          if (bVar4) {
            std::operator>>((istream *)
                            &potentialFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (string *)(partMaterial.field_2._M_local_buf + 8));
          }
          else {
            std::operator>>((istream *)
                            &potentialFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (string *)(partMaterial.field_2._M_local_buf + 8));
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&partMaterial.field_2 + 8),local_30);
            if (bVar4) {
              std::operator>>((istream *)
                              &potentialFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)(partMaterial.field_2._M_local_buf + 8));
            }
            else {
              NextAfterNewLine(&local_dc8,
                               (stringstream *)
                               &potentialFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)((long)&partMaterial.field_2 + 8));
              std::__cxx11::string::~string((string *)&local_dc8);
              bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&partMaterial.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)partBlockStart_abi_cxx11_);
              if (bVar4) {
                pLVar9 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[50]>
                          (&local_f60,
                           (char (*) [50])"Invalid material: block start missing near index ");
                local_f70 = (fpos<__mbstate_t>)std::istream::tellg();
                pbVar11 = (basic_formatter *)
                          Formatter::
                          basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                          operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_f60,&local_f70);
                Formatter::basic_formatter::operator_cast_to_string(&local_de8,pbVar11);
                Logger::error(pLVar9,&local_de8);
                std::__cxx11::string::~string((string *)&local_de8);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter(&local_f60);
                break;
              }
              pLVar9 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[11]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&techniqueName.field_2 + 8),(char (*) [11])0xc7fc3a);
              pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)(techniqueName.field_2._M_local_buf + 8),local_30);
              pbVar11 = (basic_formatter *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_(pbVar10,(char (*) [2])0xc5c617);
              Formatter::basic_formatter::operator_cast_to_string(&local_f90,pbVar11);
              Logger::debug(pLVar9,&local_f90);
              std::__cxx11::string::~string((string *)&local_f90);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)((long)&techniqueName.field_2 + 8));
              while (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&partMaterial.field_2 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)partBlockEnd_abi_cxx11_), bVar4) {
                std::operator>>((istream *)
                                &potentialFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (string *)(partMaterial.field_2._M_local_buf + 8));
                _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&partMaterial.field_2 + 8),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d80);
                if (_Var3) {
                  SkipLine((string *)(ts_1.data + 0x3f8),
                           (stringstream *)
                           &potentialFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  psVar15 = Trim((string *)(ts_1.data + 0x3f8),true);
                  ReadTechnique(this,psVar15,
                                (stringstream *)
                                &potentialFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (aiMaterial *)this_00);
                  std::__cxx11::string::~string((string *)(ts_1.data + 0x3f8));
                }
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&partMaterial.field_2 + 8),"set");
                if (bVar4) {
                  std::operator>>((istream *)
                                  &potentialFiles.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (string *)(partMaterial.field_2._M_local_buf + 8));
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&partMaterial.field_2 + 8),"$specular");
                  if (((!bVar4) &&
                      (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&partMaterial.field_2 + 8),"$diffuse"),
                      !bVar4)) &&
                     (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&partMaterial.field_2 + 8),"$ambient"),
                     !bVar4)) {
                    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&partMaterial.field_2 + 8),"$colormap");
                    if (bVar4) {
                      std::operator>>((istream *)
                                      &potentialFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (string *)(partMaterial.field_2._M_local_buf + 8));
                      aiString::aiString((aiString *)(ts_2.data + 0x3f8),
                                         (string *)((long)&partMaterial.field_2 + 8));
                      aiMaterial::AddProperty
                                ((aiMaterial *)this_00,(aiString *)(ts_2.data + 0x3f8),"$tex.file",1
                                 ,0);
                    }
                    else {
                      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&partMaterial.field_2 + 8),"$normalmap");
                      if (bVar4) {
                        std::operator>>((istream *)
                                        &potentialFiles.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (string *)(partMaterial.field_2._M_local_buf + 8));
                        aiString::aiString((aiString *)&Shininess_1,
                                           (string *)((long)&partMaterial.field_2 + 8));
                        aiMaterial::AddProperty
                                  ((aiMaterial *)this_00,(aiString *)&Shininess_1,"$tex.file",6,0);
                      }
                      else {
                        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&partMaterial.field_2 + 8),
                                                "$shininess_strength");
                        if (bVar4) {
                          std::operator>>((istream *)
                                          &potentialFiles.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (string *)(partMaterial.field_2._M_local_buf + 8));
                          pcVar16 = (char *)std::__cxx11::string::c_str();
                          local_1934 = fast_atof(pcVar16);
                          aiMaterial::AddProperty
                                    ((aiMaterial *)this_00,&local_1934,1,"$mat.shinpercent",0,0);
                        }
                        else {
                          bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&partMaterial.field_2 + 8),
                                                  "$shininess_exponent");
                          if (bVar4) {
                            std::operator>>((istream *)
                                            &potentialFiles.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (string *)(partMaterial.field_2._M_local_buf + 8));
                            pcVar16 = (char *)std::__cxx11::string::c_str();
                            local_1938 = fast_atof(pcVar16);
                            aiMaterial::AddProperty
                                      ((aiMaterial *)this_00,&local_1938,1,"$mat.shininess",0,0);
                          }
                          else {
                            bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&partMaterial.field_2 + 8),"$diffuse_map"
                                                  );
                            if (bVar4) {
                              std::operator>>((istream *)
                                              &potentialFiles.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                              (string *)(partMaterial.field_2._M_local_buf + 8));
                              pcVar16 = (char *)std::__cxx11::string::operator[]
                                                          ((ulong)((long)&partMaterial.field_2 + 8))
                              ;
                              if (*pcVar16 == '\"') {
                                std::__cxx11::string::size();
                                std::__cxx11::string::substr
                                          ((ulong)(ts_3.data + 0x3f8),
                                           (ulong)((long)&partMaterial.field_2 + 8));
                                std::__cxx11::string::operator=
                                          ((string *)(partMaterial.field_2._M_local_buf + 8),
                                           (string *)(ts_3.data + 0x3f8));
                                std::__cxx11::string::~string((string *)(ts_3.data + 0x3f8));
                              }
                              aiString::aiString((aiString *)local_1d5c,
                                                 (string *)((long)&partMaterial.field_2 + 8));
                              aiMaterial::AddProperty
                                        ((aiMaterial *)this_00,(aiString *)local_1d5c,"$tex.file",1,
                                         0);
                            }
                            else {
                              bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&partMaterial.field_2 + 8),
                                                  "$specular_map");
                              if (bVar4) {
                                std::operator>>((istream *)
                                                &potentialFiles.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                                (string *)(partMaterial.field_2._M_local_buf + 8));
                                pcVar16 = (char *)std::__cxx11::string::operator[]
                                                            ((ulong)((long)&partMaterial.field_2 + 8
                                                                    ));
                                if (*pcVar16 == '\"') {
                                  std::__cxx11::string::size();
                                  std::__cxx11::string::substr
                                            ((ulong)(ts_4.data + 0x3f8),
                                             (ulong)((long)&partMaterial.field_2 + 8));
                                  std::__cxx11::string::operator=
                                            ((string *)(partMaterial.field_2._M_local_buf + 8),
                                             (string *)(ts_4.data + 0x3f8));
                                  std::__cxx11::string::~string((string *)(ts_4.data + 0x3f8));
                                }
                                aiString::aiString((aiString *)local_2184,
                                                   (string *)((long)&partMaterial.field_2 + 8));
                                aiMaterial::AddProperty
                                          ((aiMaterial *)this_00,(aiString *)local_2184,"$tex.file",
                                           7,0);
                              }
                              else {
                                bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&partMaterial.field_2 + 8),"$normal_map")
                                ;
                                if (bVar4) {
                                  std::operator>>((istream *)
                                                  &potentialFiles.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(string *)(partMaterial.field_2._M_local_buf + 8)
                                                 );
                                  pcVar16 = (char *)std::__cxx11::string::operator[]
                                                              ((ulong)((long)&partMaterial.field_2 +
                                                                      8));
                                  if (*pcVar16 == '\"') {
                                    std::__cxx11::string::size();
                                    std::__cxx11::string::substr
                                              ((ulong)(ts_5.data + 0x3f8),
                                               (ulong)((long)&partMaterial.field_2 + 8));
                                    std::__cxx11::string::operator=
                                              ((string *)(partMaterial.field_2._M_local_buf + 8),
                                               (string *)(ts_5.data + 0x3f8));
                                    std::__cxx11::string::~string((string *)(ts_5.data + 0x3f8));
                                  }
                                  aiString::aiString((aiString *)local_25ac,
                                                     (string *)((long)&partMaterial.field_2 + 8));
                                  aiMaterial::AddProperty
                                            ((aiMaterial *)this_00,(aiString *)local_25ac,
                                             "$tex.file",6,0);
                                }
                                else {
                                  bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&partMaterial.field_2 + 8),"$light_map");
                                  if (bVar4) {
                                    std::operator>>((istream *)
                                                    &potentialFiles.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(string *)(partMaterial.field_2._M_local_buf + 8)
                                                  );
                                    pcVar16 = (char *)std::__cxx11::string::operator[]
                                                                ((ulong)((long)&partMaterial.field_2
                                                                        + 8));
                                    if (*pcVar16 == '\"') {
                                      std::__cxx11::string::size();
                                      std::__cxx11::string::substr
                                                ((ulong)(ts_6.data + 0x3f8),
                                                 (ulong)((long)&partMaterial.field_2 + 8));
                                      std::__cxx11::string::operator=
                                                ((string *)(partMaterial.field_2._M_local_buf + 8),
                                                 (string *)(ts_6.data + 0x3f8));
                                      std::__cxx11::string::~string((string *)(ts_6.data + 0x3f8));
                                    }
                                    aiString::aiString((aiString *)local_29d4,
                                                       (string *)((long)&partMaterial.field_2 + 8));
                                    aiMaterial::AddProperty
                                              ((aiMaterial *)this_00,(aiString *)local_29d4,
                                               "$tex.file",10,0);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::operator>>((istream *)
                              &potentialFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)(partMaterial.field_2._M_local_buf + 8));
            }
          }
        }
      }
      stream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._4_4_ = 1;
      this_local = this_00;
      std::__cxx11::string::~string((string *)local_d80);
      std::__cxx11::string::~string((string *)local_d58);
      std::__cxx11::string::~string((string *)(partMaterial.field_2._M_local_buf + 8));
    }
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &potentialFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local = (OgreImporter *)0x0;
  }
  return (aiMaterial *)this_local;
}

Assistant:

aiMaterial* OgreImporter::ReadMaterial(const std::string &pFile, Assimp::IOSystem *pIOHandler, const std::string &materialName)
{
    if (materialName.empty()) {
        return 0;
    }

    // Full reference and examples of Ogre Material Script
    // can be found from http://www.ogre3d.org/docs/manual/manual_14.html

    /*and here is another one:

    import * from abstract_base_passes_depth.material
    import * from abstract_base.material
    import * from mat_shadow_caster.material
    import * from mat_character_singlepass.material

    material hero/hair/caster : mat_shadow_caster_skin_areject
    {
      set $diffuse_map "hero_hair_alpha_c.dds"
    }

    material hero/hair_alpha : mat_char_cns_singlepass_areject_4weights
    {
      set $diffuse_map  "hero_hair_alpha_c.dds"
      set $specular_map "hero_hair_alpha_s.dds"
      set $normal_map   "hero_hair_alpha_n.dds"
      set $light_map    "black_lightmap.dds"

      set $shadow_caster_material "hero/hair/caster"
    }
    */

    stringstream ss;

    // Scope for scopre_ptr auto release
    {
        /* There are three .material options in priority order:
            1) File with the material name (materialName)
            2) File with the mesh files base name (pFile)
            3) Optional user defined material library file (m_userDefinedMaterialLibFile) */
        std::vector<string> potentialFiles;
        potentialFiles.push_back(materialName + ".material");
        potentialFiles.push_back(pFile.substr(0, pFile.rfind(".mesh")) + ".material");
        if (!m_userDefinedMaterialLibFile.empty())
            potentialFiles.push_back(m_userDefinedMaterialLibFile);

        IOStream *materialFile = 0;
        for(size_t i=0; i<potentialFiles.size(); ++i)
        {
            materialFile = pIOHandler->Open(potentialFiles[i]);
            if (materialFile) {
                break;
            }
            ASSIMP_LOG_DEBUG_F( "Source file for material '", materialName, "' ", potentialFiles[i], " does not exist");
        }
        if (!materialFile)
        {
            ASSIMP_LOG_ERROR_F( "Failed to find source file for material '", materialName, "'");
            return 0;
        }

        std::unique_ptr<IOStream> stream(materialFile);
        if (stream->FileSize() == 0)
        {
            ASSIMP_LOG_WARN_F( "Source file for material '", materialName, "' is empty (size is 0 bytes)");
            return 0;
        }

        // Read bytes
        vector<char> data(stream->FileSize());
        stream->Read(&data[0], stream->FileSize(), 1);

        // Convert to UTF-8 and terminate the string for ss
        BaseImporter::ConvertToUTF8(data);
        data.push_back('\0');

        ss << &data[0];
    }

    ASSIMP_LOG_DEBUG_F("Reading material '", materialName, "'");

    aiMaterial *material = new aiMaterial();
    m_textures.clear();

    aiString ts(materialName);
    material->AddProperty(&ts, AI_MATKEY_NAME);

    // The stringstream will push words from a line until newline.
    // It will also trim whitespace from line start and between words.
    string linePart;
    ss >> linePart;

    const string partMaterial   = "material";
    const string partTechnique  = "technique";

    while(!ss.eof())
    {
        // Skip commented lines
        if (linePart == partComment)
        {
            NextAfterNewLine(ss, linePart);
            continue;
        }
        if (linePart != partMaterial)
        {
            ss >> linePart;
            continue;
        }

        ss >> linePart;
        if (linePart != materialName)
        {
            ss >> linePart;
            continue;
        }

        NextAfterNewLine(ss, linePart);
        if (linePart != partBlockStart)
        {
            ASSIMP_LOG_ERROR_F( "Invalid material: block start missing near index ", ss.tellg());
            return material;
        }

        ASSIMP_LOG_DEBUG_F("material '", materialName, "'");

        while(linePart != partBlockEnd)
        {
            // Proceed to the first technique
            ss >> linePart;

            if (linePart == partTechnique)
            {
                string techniqueName = SkipLine(ss);
                ReadTechnique(Trim(techniqueName), ss, material);
            }

            // Read information from a custom material
            /** @todo This "set $x y" does not seem to be a official Ogre material system feature.
                Materials can inherit other materials and override texture units by using the (unique)
                parent texture unit name in your cloned material.
                This is not yet supported and below code is probably some hack from the original
                author of this Ogre importer. Should be removed? */
            if (linePart=="set")
            {
                ss >> linePart;
                if (linePart=="$specular")//todo load this values:
                {
                }
                else if (linePart=="$diffuse")
                {
                }
                else if (linePart=="$ambient")
                {
                }
                else if (linePart=="$colormap")
                {
                    ss >> linePart;
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
                }
                else if (linePart=="$normalmap")
                {
                    ss >> linePart;
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_NORMALS, 0));
                }
                else if (linePart=="$shininess_strength")
                {
                    ss >> linePart;
                    float Shininess = fast_atof(linePart.c_str());
                    material->AddProperty(&Shininess, 1, AI_MATKEY_SHININESS_STRENGTH);
                }
                else if (linePart=="$shininess_exponent")
                {
                    ss >> linePart;
                    float Shininess = fast_atof(linePart.c_str());
                    material->AddProperty(&Shininess, 1, AI_MATKEY_SHININESS);
                }
                //Properties from Venetica:
                else if (linePart=="$diffuse_map")
                {
                    ss >> linePart;
                    if (linePart[0] == '"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
                }
                else if (linePart=="$specular_map")
                {
                    ss >> linePart;
                    if (linePart[0] == '"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_SHININESS, 0));
                }
                else if (linePart=="$normal_map")
                {
                    ss >> linePart;
                    if (linePart[0]=='"')// "file" -> file
                        linePart = linePart.substr(1, linePart.size()-2);
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_NORMALS, 0));
                }
                else if (linePart=="$light_map")
                {
                    ss >> linePart;
                    if (linePart[0]=='"') {
                        linePart = linePart.substr(1, linePart.size() - 2);
                    }
                    aiString ts(linePart);
                    material->AddProperty(&ts, AI_MATKEY_TEXTURE(aiTextureType_LIGHTMAP, 0));
                }
            }
        }
        ss >> linePart;
    }

    return material;
}